

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O2

void __thiscall HashTable<int>::diaplay(HashTable<int> *this)

{
  ostream *poVar1;
  node *pnVar2;
  int i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
    if (this->HashArray[lVar3].key != 9999999) {
      poVar1 = std::operator<<((ostream *)&std::cout,"key:");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->HashArray[lVar3].key);
      poVar1 = std::operator<<(poVar1,"\tvalue:");
      std::ostream::operator<<(poVar1,this->HashArray[lVar3].value);
      pnVar2 = this->HashArray + lVar3;
      while (pnVar2 = pnVar2->next, pnVar2 != (node *)0x0) {
        poVar1 = std::operator<<((ostream *)&std::cout,"\tkey:");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,pnVar2->key);
        poVar1 = std::operator<<(poVar1,"\tvalue:");
        std::ostream::operator<<(poVar1,pnVar2->value);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  return;
}

Assistant:

void diaplay() {
		for (int i = 0; i < 20; i++) {
			if (HashArray[i].key != MyNull) {
				cout <<"key:"<< HashArray[i].key << "	value:" << HashArray[i].value;
				Node *p = &HashArray[i];
				while (p->next != NULL) {
					p = p->next;
					cout <<"	key:"<< p->key << "	value:" << p->value;
				}
				cout << endl;
			}
		}
	}